

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O2

void __thiscall bandit::reporter::info::output_context_start_message(info *this)

{
  ostream *poVar1;
  _Elt_pointer pcVar2;
  string asStack_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38;
  
  poVar1 = (this->super_colored_base).stm_;
  indent_abi_cxx11_(&local_38,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[4])(local_58);
  poVar1 = std::operator<<(poVar1,local_58);
  poVar1 = std::operator<<(poVar1,"begin ");
  (*((this->super_colored_base).colorizer_)->_vptr_interface[6])(local_78);
  poVar1 = std::operator<<(poVar1,local_78);
  pcVar2 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar2 == (this->context_stack_).c.
                super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pcVar2 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
  }
  poVar1 = std::operator<<(poVar1,(string *)(pcVar2 + -1));
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(asStack_98);
  poVar1 = std::operator<<(poVar1,asStack_98);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&local_38);
  this->indentation_ = this->indentation_ + 1;
  std::ostream::flush();
  return;
}

Assistant:

void output_context_start_message() {
        stm_
            << indent()
            << colorizer_.info()
            << "begin "
            << colorizer_.emphasize()
            << context_stack_.top().desc
            << colorizer_.reset()
            << std::endl;
        ++indentation_;
        stm_.flush();
      }